

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::run_GreedyAlgorithm(Graph *this)

{
  bool bVar1;
  bool bVar2;
  Node *pNVar3;
  ostream *poVar4;
  Graph *in_RDI;
  double tmp_distance;
  int node_idx;
  bool is_return_depot;
  double min_distance;
  int best_node_idx;
  int car_idx;
  double **in_stack_ffffffffffffff70;
  Node *in_stack_ffffffffffffff78;
  Car *in_stack_ffffffffffffff80;
  int local_20;
  double local_18;
  int local_c;
  
  local_c = 0;
LAB_00114c87:
  do {
    bVar1 = is_all_visited(in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00114f8d:
      if (in_RDI->cars[local_c].now_idx != 0) {
        Car::add_node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
        ;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"algorithm done.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return;
    }
    local_18 = 100000.0;
    bVar1 = true;
    bVar2 = std::vector<Node,_std::allocator<Node>_>::empty
                      ((vector<Node,_std::allocator<Node>_> *)in_stack_ffffffffffffff80);
    if (bVar2) {
      Car::add_node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    for (local_20 = 1; local_20 < in_RDI->num_node; local_20 = local_20 + 1) {
      if ((in_RDI->nodes[local_20].visited & 1U) == 0) {
        pNVar3 = in_RDI->nodes + local_20;
        in_stack_ffffffffffffff70 = *(double ***)&pNVar3->idx;
        in_stack_ffffffffffffff78 = *(Node **)&pNVar3->visited;
        in_stack_ffffffffffffff80 = *(Car **)&pNVar3->tw_close;
        bVar2 = Car::ok_capacity(in_RDI->cars + local_c,*pNVar3);
        if (bVar2) {
          pNVar3 = in_RDI->nodes + local_20;
          in_stack_ffffffffffffff70 = *(double ***)&pNVar3->idx;
          in_stack_ffffffffffffff78 = *(Node **)&pNVar3->visited;
          in_stack_ffffffffffffff80 = *(Car **)&pNVar3->tw_close;
          bVar2 = Car::ok_time(in_RDI->cars + local_c,*pNVar3,in_RDI->distance_matrix);
          if ((bVar2) &&
             (in_RDI->distance_matrix[in_RDI->cars[local_c].now_idx][local_20] < local_18)) {
            bVar1 = false;
            local_18 = in_RDI->distance_matrix[in_RDI->cars[local_c].now_idx][local_20];
          }
        }
      }
    }
    if (!bVar1) {
      Car::add_node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      goto LAB_00114c87;
    }
    if (in_RDI->num_car <= local_c + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Cannot solve this by Greedy algorithm.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      goto LAB_00114f8d;
    }
    if (in_RDI->cars[local_c].now_idx != 0) {
      Car::add_node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void Graph::run_GreedyAlgorithm()
{
	int car_idx = 0;
	while(!is_all_visited()){
		int best_node_idx;
		double min_distance = 100000;
		bool is_return_depot = true;
		
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] is depot
		}

		for(int node_idx = 1; node_idx < num_node; node_idx++){
			if(!nodes[node_idx].visited){
				if(cars[car_idx].ok_capacity(nodes[node_idx])){
					if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
						double tmp_distance = distance_matrix[cars[car_idx].now_idx][node_idx];
						if(tmp_distance < min_distance){
							min_distance = tmp_distance;
							is_return_depot = false;
							best_node_idx = node_idx;
						}
					}
				}
			}
		}

		if(!is_return_depot){
			cars[car_idx].add_node(&nodes[best_node_idx], distance_matrix);
		}
		else{// if edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle
			}
			else{
				std::cout << "Cannot solve this by Greedy algorithm." << std::endl;
				break;// std::exit(0);
			}
			
		}
	}//while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
				cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
	std::cout << "algorithm done." << std::endl;
}